

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)1>::decodeD
          (Predecoder<(InstructionSet::M68k::Model)1> *this,uint16_t instruction)

{
  uint uVar1;
  Preinstruction PVar2;
  uint uVar3;
  
  uVar3 = (uint)instruction;
  uVar1 = uVar3 & 0x1f0;
  if (uVar1 == 0x180) {
    uVar1 = instruction >> 1 & 4;
    return (Preinstruction)
           (((uVar3 & 7) << 8 | uVar1 << 0xb) + ((uVar3 & 0xe00) << 7 | uVar1 << 0x13) + 0x200000c);
  }
  if (uVar1 != 0x140) {
    if (uVar1 == 0x100) {
      uVar1 = instruction >> 1 & 4;
      return (Preinstruction)
             (((uVar3 & 7) << 8 | uVar1 << 0xb) + ((uVar3 & 0xe00) << 7 | uVar1 << 0x13) + 10);
    }
    switch(instruction >> 6 & 7) {
    case 0:
      PVar2 = decode<(unsigned_char)188,true>(this,instruction);
      return PVar2;
    case 1:
      PVar2 = decode<(unsigned_char)189,true>(this,instruction);
      return PVar2;
    case 2:
      PVar2 = decode<(unsigned_char)190,true>(this,instruction);
      return PVar2;
    case 3:
      PVar2 = decode<(unsigned_char)8,true>(this,instruction);
      return PVar2;
    case 4:
      PVar2 = decode<(unsigned_char)185,true>(this,instruction);
      return PVar2;
    case 5:
      PVar2 = decode<(unsigned_char)186,true>(this,instruction);
      return PVar2;
    case 6:
      PVar2 = decode<(unsigned_char)187,true>(this,instruction);
      return PVar2;
    case 7:
      PVar2 = decode<(unsigned_char)9,true>(this,instruction);
      return PVar2;
    }
  }
  uVar1 = instruction >> 1 & 4;
  return (Preinstruction)
         (((uVar3 & 7) << 8 | uVar1 << 0xb) + ((uVar3 & 0xe00) << 7 | uVar1 << 0x13) + 0x100000b);
}

Assistant:

Preinstruction Predecoder<model>::decodeD(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0x1f0) {
		// 4-14 (p118)
		case 0x100:	Decode(Op::ADDXb);
		case 0x140:	Decode(Op::ADDXw);
		case 0x180:	Decode(Op::ADDXl);

		default:	break;
	}

	switch(instruction & 0x1c0) {
		// 4-7 (p111)
		case 0x0c0:	Decode(Op::ADDAw);
		case 0x1c0:	Decode(Op::ADDAl);

		// 4-4 (p108)
		case 0x000:	Decode(ADDtoRb);
		case 0x040:	Decode(ADDtoRw);
		case 0x080:	Decode(ADDtoRl);
		case 0x100:	Decode(ADDtoMb);
		case 0x140:	Decode(ADDtoMw);
		case 0x180:	Decode(ADDtoMl);

		default:	break;
	}

	return Preinstruction();
}